

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffexist(char *infile,int *exists,int *status)

{
  int iVar1;
  char *pcVar2;
  char **local_440;
  char *ptr1;
  char rootname [1025];
  FILE *diskfile;
  int *status_local;
  int *exists_local;
  char *infile_local;
  
  if (*status < 1) {
    ffrtnm(infile,(char *)&ptr1,status);
    pcVar2 = strstr((char *)&ptr1,"://");
    if ((pcVar2 == (char *)0x0) && ((char)ptr1 != '-')) {
      local_440 = &ptr1;
    }
    else {
      iVar1 = strncmp((char *)&ptr1,"file",4);
      if (iVar1 != 0) {
        *exists = -1;
        return *status;
      }
      local_440 = (char **)(pcVar2 + 3);
    }
    iVar1 = file_openfile((char *)local_440,0,(FILE **)(rootname + 0x400));
    if (iVar1 == 0) {
      *exists = 1;
      fclose(stack0xffffffffffffffd0);
    }
    else {
      iVar1 = file_is_compressed((char *)local_440);
      if (iVar1 == 0) {
        *exists = 0;
      }
      else {
        *exists = 2;
      }
    }
    infile_local._4_4_ = *status;
  }
  else {
    infile_local._4_4_ = *status;
  }
  return infile_local._4_4_;
}

Assistant:

int ffexist(const char *infile, /* I - input filename or URL */
            int *exists,        /* O -  2 = a compressed version of file exists */
	                        /*      1 = yes, disk file exists               */
	                        /*      0 = no, disk file could not be found    */
				/*     -1 = infile is not a disk file (could    */
				/*   be a http, ftp, gsiftp, smem, or stdin file) */
            int *status)        /* I/O  status  */

/*
   test if the input file specifier is an existing file on disk
   If the specified file can't be found, it then searches for a 
   compressed version of the file.
*/
{
    FILE *diskfile;
    char rootname[FLEN_FILENAME];
    char *ptr1;
    
    if (*status > 0)
        return(*status);

    /* strip off any extname or filters from the name */
    ffrtnm( (char *)infile, rootname, status);

    ptr1 = strstr(rootname, "://");
    
    if (ptr1 || *rootname == '-') {
        if (!strncmp(rootname, "file", 4) ) {
	    ptr1 = ptr1 + 3;   /* pointer to start of the disk file name */
	} else {
	    *exists = -1;   /* this is not a disk file */
	    return (*status);
	}
    } else {
        ptr1 = rootname;
    }
    
    /* see if the disk file exists */
    if (file_openfile(ptr1, 0, &diskfile)) {
    
        /* no, couldn't open file, so see if there is a compressed version */
        if (file_is_compressed(ptr1) ) {
           *exists = 2;  /* a compressed version of the file exists */
        } else {
	   *exists = 0;  /* neither file nor compressed version exist */
	}
	
    } else {
    
        /* yes, file exists */
        *exists = 1; 
	fclose(diskfile);
    }
    	   
    return(*status);
}